

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHelpers.hpp
# Opt level: O1

SoapySDRArgInfo * toArgInfo(SoapySDRArgInfo *__return_storage_ptr__,ArgInfo *info)

{
  double dVar1;
  size_t sVar2;
  double dVar3;
  char *pcVar4;
  char **ppcVar5;
  size_t namesLength;
  size_t local_20;
  
  __return_storage_ptr__->options = (char **)0x0;
  __return_storage_ptr__->optionNames = (char **)0x0;
  (__return_storage_ptr__->range).step = 0.0;
  __return_storage_ptr__->numOptions = 0;
  (__return_storage_ptr__->range).minimum = 0.0;
  (__return_storage_ptr__->range).maximum = 0.0;
  __return_storage_ptr__->units = (char *)0x0;
  *(undefined8 *)&__return_storage_ptr__->type = 0;
  __return_storage_ptr__->name = (char *)0x0;
  __return_storage_ptr__->description = (char *)0x0;
  __return_storage_ptr__->key = (char *)0x0;
  __return_storage_ptr__->value = (char *)0x0;
  pcVar4 = callocArrayType<char>((info->key)._M_string_length + 1);
  sVar2 = (info->key)._M_string_length;
  if (sVar2 != 0) {
    memmove(pcVar4,(info->key)._M_dataplus._M_p,sVar2);
  }
  __return_storage_ptr__->key = pcVar4;
  pcVar4 = callocArrayType<char>((info->value)._M_string_length + 1);
  sVar2 = (info->value)._M_string_length;
  if (sVar2 != 0) {
    memmove(pcVar4,(info->value)._M_dataplus._M_p,sVar2);
  }
  __return_storage_ptr__->value = pcVar4;
  pcVar4 = callocArrayType<char>((info->name)._M_string_length + 1);
  sVar2 = (info->name)._M_string_length;
  if (sVar2 != 0) {
    memmove(pcVar4,(info->name)._M_dataplus._M_p,sVar2);
  }
  __return_storage_ptr__->name = pcVar4;
  pcVar4 = callocArrayType<char>((info->description)._M_string_length + 1);
  sVar2 = (info->description)._M_string_length;
  if (sVar2 != 0) {
    memmove(pcVar4,(info->description)._M_dataplus._M_p,sVar2);
  }
  __return_storage_ptr__->description = pcVar4;
  pcVar4 = callocArrayType<char>((info->units)._M_string_length + 1);
  sVar2 = (info->units)._M_string_length;
  if (sVar2 != 0) {
    memmove(pcVar4,(info->units)._M_dataplus._M_p,sVar2);
  }
  __return_storage_ptr__->units = pcVar4;
  __return_storage_ptr__->type = info->type;
  dVar1 = (info->range)._step;
  dVar3 = (info->range)._max;
  (__return_storage_ptr__->range).minimum = (info->range)._min;
  (__return_storage_ptr__->range).maximum = dVar3;
  (__return_storage_ptr__->range).step = dVar1;
  ppcVar5 = toStrArray(&info->options,&__return_storage_ptr__->numOptions,0);
  __return_storage_ptr__->options = ppcVar5;
  local_20 = 0;
  ppcVar5 = toStrArray(&info->optionNames,&local_20,__return_storage_ptr__->numOptions);
  __return_storage_ptr__->optionNames = ppcVar5;
  return __return_storage_ptr__;
}

Assistant:

static inline SoapySDRArgInfo toArgInfo(const SoapySDR::ArgInfo &info)
{
    SoapySDRArgInfo out;
    std::memset(&out, 0, sizeof(out));
    try
    {
        out.key = toCString(info.key);
        out.value = toCString(info.value);
        out.name = toCString(info.name);
        out.description = toCString(info.description);
        out.units = toCString(info.units);
        out.type = SoapySDRArgInfoType(info.type);
        out.range = toRange(info.range);
        out.options = toStrArray(info.options, &out.numOptions);
        size_t namesLength = 0;
        // will be calloc-ed to be at least as long as options to prevent clients from reading garbage
        out.optionNames = toStrArray(info.optionNames, &namesLength, out.numOptions);
    }
    catch (const std::bad_alloc &)
    {
        SoapySDRArgInfo_clear(&out);
        throw;
    }

    return out;
}